

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderResult
duckdb_brotli::SaveErrorCode
          (BrotliDecoderStateInternal *s,BrotliDecoderErrorCode e,size_t consumed_input)

{
  size_t consumed_input_local;
  BrotliDecoderErrorCode e_local;
  BrotliDecoderStateInternal *s_local;
  BrotliDecoderResult local_4;
  
  s->error_code = e;
  s->used_input = consumed_input + s->used_input;
  if ((s->buffer_length != 0) && ((s->br).next_in == (s->br).last_in)) {
    s->buffer_length = 0;
  }
  if (e == BROTLI_DECODER_SUCCESS) {
    local_4 = BROTLI_DECODER_RESULT_SUCCESS;
  }
  else if (e == BROTLI_DECODER_NEEDS_MORE_INPUT) {
    local_4 = BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
  }
  else if (e == BROTLI_DECODER_NEEDS_MORE_OUTPUT) {
    local_4 = BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;
  }
  else {
    local_4 = BROTLI_DECODER_RESULT_ERROR;
  }
  return local_4;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderResult SaveErrorCode(BrotliDecoderState *s, BrotliDecoderErrorCode e,
                                                         size_t consumed_input) {
	s->error_code = (int)e;
	s->used_input += consumed_input;
	if ((s->buffer_length != 0) && (s->br.next_in == s->br.last_in)) {
		/* If internal buffer is depleted at last, reset it. */
		s->buffer_length = 0;
	}
	switch (e) {
	case BROTLI_DECODER_SUCCESS:
		return BROTLI_DECODER_RESULT_SUCCESS;

	case BROTLI_DECODER_NEEDS_MORE_INPUT:
		return BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;

	case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
		return BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;

	default:
		return BROTLI_DECODER_RESULT_ERROR;
	}
}